

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ma_uint32 mVar1;
  ma_dr_flac_seekpoint *pmVar2;
  bool bVar3;
  bool bVar4;
  ma_bool32 mVar5;
  ma_result mVar6;
  ma_uint64 mVar7;
  long lVar8;
  long lVar9;
  ma_bool32 unaff_EBP;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ma_dr_flac_seekpoint *pmVar13;
  ma_uint64 mVar14;
  ulong uVar15;
  ma_uint64 byteRangeHi;
  char cVar16;
  float fVar17;
  
  pmVar2 = pFlac->pSeekpoints;
  if (pmVar2 == (ma_dr_flac_seekpoint *)0x0) {
    return 0;
  }
  mVar1 = pFlac->seekpointCount;
  if (mVar1 == 0) {
    return 0;
  }
  if (pcmFrameIndex < pmVar2->firstPCMFrame) {
    return 0;
  }
  uVar11 = 0;
  if (pmVar2->firstPCMFrame < pcmFrameIndex) {
    uVar10 = 0xffffffff;
    pmVar13 = pmVar2;
    do {
      pmVar13 = pmVar13 + 1;
      uVar11 = mVar1 - 1;
      if ((1 - mVar1) + uVar10 == -1) break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar10;
    } while (pmVar13->firstPCMFrame < pcmFrameIndex);
  }
  if (pmVar2[uVar11].pcmFrameCount == 0) {
    return 0;
  }
  if (pFlac->maxBlockSizeInPCMFrames < pmVar2[uVar11].pcmFrameCount) {
    return 0;
  }
  uVar12 = pFlac->totalPCMFrameCount;
  if (uVar12 < pmVar2[uVar11].firstPCMFrame && uVar12 != 0) {
    return 0;
  }
  if (uVar12 == 0) goto LAB_00178957;
  mVar14 = pFlac->firstFLACFramePosInBytes;
  fVar17 = (float)(long)((ulong)pFlac->bitsPerSample * uVar12 * pFlac->channels) * 0.125;
  uVar12 = (ulong)fVar17;
  byteRangeHi = ((long)(fVar17 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12) + mVar14;
  if (uVar11 < mVar1 - 1) {
    unaff_EBP = 0;
    if ((pmVar2[uVar11].flacFrameOffset < pmVar2[uVar11 + 1].flacFrameOffset) &&
       (pmVar2[uVar11 + 1].pcmFrameCount != 0)) {
      if (pmVar2[uVar11 + 1].firstPCMFrame != 0xffffffffffffffff) {
        byteRangeHi = (mVar14 - 1) + pmVar2[uVar11 + 1].flacFrameOffset;
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    bVar4 = false;
    if (bVar3) goto LAB_001788e4;
  }
  else {
LAB_001788e4:
    mVar14 = pmVar2[uVar11].flacFrameOffset + mVar14;
    mVar5 = ma_dr_flac__seek_to_byte(&pFlac->bs,mVar14);
    if ((mVar5 != 0) &&
       (mVar5 = ma_dr_flac__read_next_flac_frame_header
                          (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header),
       mVar5 != 0)) {
      mVar7 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
      if (mVar7 == 0) {
        mVar7 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
      }
      pFlac->currentPCMFrame = mVar7;
      mVar5 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                        (pFlac,pcmFrameIndex,mVar14,byteRangeHi);
      if (mVar5 != 0) {
        unaff_EBP = 1;
        bVar4 = false;
        goto LAB_00178951;
      }
    }
    unaff_EBP = 0;
    bVar4 = true;
  }
LAB_00178951:
  if (!bVar4) {
    return unaff_EBP;
  }
LAB_00178957:
  uVar12 = pFlac->currentPCMFrame;
  if ((pcmFrameIndex < uVar12) || (uVar12 < pFlac->pSeekpoints[uVar11].firstPCMFrame)) {
    uVar12 = pFlac->pSeekpoints[uVar11].firstPCMFrame;
    mVar5 = ma_dr_flac__seek_to_byte
                      (&pFlac->bs,
                       pFlac->pSeekpoints[uVar11].flacFrameOffset + pFlac->firstFLACFramePosInBytes)
    ;
    if (mVar5 == 0) {
      return 0;
    }
    mVar5 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
    bVar3 = false;
    if (mVar5 == 0) {
      return 0;
    }
  }
  else {
    bVar3 = true;
    if ((uVar12 == 0) && ((pFlac->currentFLACFrame).pcmFramesRemaining == 0)) {
      mVar5 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      bVar3 = false;
      if (mVar5 == 0) {
        return 0;
      }
      uVar12 = 0;
    }
  }
  do {
    mVar14 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (mVar14 == 0) {
      mVar14 = (ulong)pFlac->maxBlockSizeInPCMFrames *
               (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    lVar8 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar14;
    lVar9 = lVar8 + -1;
    if (lVar8 == 0) {
      lVar9 = 0;
    }
    uVar15 = (uVar12 - mVar14) + lVar9 + 1;
    if (pcmFrameIndex < uVar15) {
      if (bVar3) {
LAB_00178a69:
        mVar14 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex - uVar12);
        unaff_EBP = (ma_bool32)(mVar14 == pcmFrameIndex - uVar12);
        bVar4 = false;
      }
      else {
        mVar6 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar6 == MA_CRC_MISMATCH) {
          bVar4 = true;
        }
        else {
          if (mVar6 == MA_SUCCESS) goto LAB_00178a69;
          bVar4 = false;
          unaff_EBP = 0;
        }
      }
      cVar16 = '\x01';
      uVar15 = uVar12;
      mVar5 = unaff_EBP;
      if (bVar4) goto LAB_00178abb;
    }
    else {
      if (bVar3) {
        uVar15 = uVar12 + (pFlac->currentFLACFrame).pcmFramesRemaining;
        (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
      }
      else {
        mVar6 = ma_dr_flac__seek_flac_frame(pFlac);
        if (mVar6 == MA_SUCCESS) {
          cVar16 = '\0';
        }
        else if (mVar6 == MA_CRC_MISMATCH) {
          cVar16 = '\a';
          uVar15 = uVar12;
        }
        else {
          unaff_EBP = 0;
          cVar16 = '\x01';
          uVar15 = uVar12;
        }
        if (cVar16 != '\0') {
          bVar3 = false;
          uVar12 = uVar15;
          mVar5 = unaff_EBP;
          if (cVar16 == '\a') goto LAB_00178abb;
          goto LAB_00178adb;
        }
      }
      bVar3 = false;
      if (pFlac->totalPCMFrameCount == pcmFrameIndex) {
        cVar16 = '\x01';
        uVar12 = uVar15;
        mVar5 = 1;
        if (uVar15 == pFlac->totalPCMFrameCount) goto LAB_00178adb;
      }
LAB_00178abb:
      mVar5 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      cVar16 = mVar5 == 0;
      uVar12 = uVar15;
      mVar5 = unaff_EBP;
      if ((bool)cVar16) {
        mVar5 = 0;
      }
    }
LAB_00178adb:
    unaff_EBP = mVar5;
    if (cVar16 != '\0') {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_uint32 iClosestSeekpoint = 0;
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    ma_uint32 iSeekpoint;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pFlac->pSeekpoints == NULL || pFlac->seekpointCount == 0) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[0].firstPCMFrame > pcmFrameIndex) {
        return MA_FALSE;
    }
    for (iSeekpoint = 0; iSeekpoint < pFlac->seekpointCount; ++iSeekpoint) {
        if (pFlac->pSeekpoints[iSeekpoint].firstPCMFrame >= pcmFrameIndex) {
            break;
        }
        iClosestSeekpoint = iSeekpoint;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount == 0 || pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount > pFlac->maxBlockSizeInPCMFrames) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame > pFlac->totalPCMFrameCount && pFlac->totalPCMFrameCount > 0) {
        return MA_FALSE;
    }
#if !defined(MA_DR_FLAC_NO_CRC)
    if (pFlac->totalPCMFrameCount > 0) {
        ma_uint64 byteRangeLo;
        ma_uint64 byteRangeHi;
        byteRangeHi = pFlac->firstFLACFramePosInBytes + (ma_uint64)((ma_int64)(pFlac->totalPCMFrameCount * pFlac->channels * pFlac->bitsPerSample)/8.0f);
        byteRangeLo = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset;
        if (iClosestSeekpoint < pFlac->seekpointCount-1) {
            ma_uint32 iNextSeekpoint = iClosestSeekpoint + 1;
            if (pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset >= pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset || pFlac->pSeekpoints[iNextSeekpoint].pcmFrameCount == 0) {
                return MA_FALSE;
            }
            if (pFlac->pSeekpoints[iNextSeekpoint].firstPCMFrame != (((ma_uint64)0xFFFFFFFF << 32) | 0xFFFFFFFF)) {
                byteRangeHi = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset - 1;
            }
        }
        if (ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            if (ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
                if (ma_dr_flac__seek_to_pcm_frame__binary_search_internal(pFlac, pcmFrameIndex, byteRangeLo, byteRangeHi)) {
                    return MA_TRUE;
                }
            }
        }
    }
#endif
    if (pcmFrameIndex >= pFlac->currentPCMFrame && pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame <= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}